

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::make_exception<const_char_*,_hta::Clock::time_point>::operator()
          (make_exception<const_char_*,_hta::Clock::time_point> *this,stringstream *msg,char *arg,
          time_point args)

{
  make_exception<hta::Clock::time_point> local_29;
  char *local_28;
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*,_hta::Clock::time_point> *this_local;
  time_point args_local;
  
  local_28 = arg;
  arg_local = (char *)msg;
  msg_local = (stringstream *)this;
  this_local = (make_exception<const_char_*,_hta::Clock::time_point> *)
               args.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
  std::operator<<((ostream *)(msg + 0x10),arg);
  make_exception<hta::Clock::time_point>::operator()
            (&local_29,(stringstream *)arg_local,(time_point)this_local);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }